

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int32_t ffi_checkint(lua_State *L,int narg)

{
  int32_t local_5c;
  TValue *pTStack_58;
  int32_t i;
  TValue *o;
  CTState *cts;
  lua_State *plStack_40;
  int narg_local;
  lua_State *L_local;
  CTState *cts_1;
  undefined4 local_24;
  TValue *local_20;
  undefined4 local_14;
  TValue *local_10;
  
  o = *(TValue **)((L->glref).ptr64 + 0x180);
  o[2] = (TValue)L;
  pTStack_58 = L->base + (long)narg + -1;
  cts._4_4_ = narg;
  plStack_40 = L;
  L_local = (lua_State *)o;
  cts_1 = (CTState *)L;
  if (L->top <= pTStack_58) {
    lj_err_arg(L,narg,LJ_ERR_NOVAL);
  }
  local_24 = 9;
  local_14 = 9;
  local_20 = o;
  local_10 = o;
  lj_cconv_ct_tv((CTState *)&o->gcr,(CType *)(o->u64 + 0xd8),(uint8_t *)&local_5c,pTStack_58,
                 narg << 8);
  return local_5c;
}

Assistant:

static int32_t ffi_checkint(lua_State *L, int narg)
{
  CTState *cts = ctype_cts(L);
  TValue *o = L->base + narg-1;
  int32_t i;
  if (o >= L->top)
    lj_err_arg(L, narg, LJ_ERR_NOVAL);
  lj_cconv_ct_tv(cts, ctype_get(cts, CTID_INT32), (uint8_t *)&i, o,
		 CCF_ARG(narg));
  return i;
}